

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.hpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::
LookupPred<ot::commissioner::persistent_storage::Domain>
          (PersistentStorageJson *this,
          function<bool_(const_ot::commissioner::persistent_storage::Domain_&)> *aPred,
          vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
          *aRet,string *aArrName)

{
  pointer pDVar1;
  pointer pDVar2;
  reference pvVar3;
  function<bool_(const_ot::commissioner::persistent_storage::Domain_&)> local_90;
  iterator local_70;
  iterator local_50;
  
  pDVar1 = (aRet->
           super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pDVar2 = (aRet->
           super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](&this->mCache,aArrName);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::begin(&local_50,pvVar3);
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](&this->mCache,aArrName);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end(&local_70,pvVar3);
  std::function<bool_(const_ot::commissioner::persistent_storage::Domain_&)>::function
            (&local_90,aPred);
  std::
  copy_if<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::back_insert_iterator<std::vector<ot::commissioner::persistent_storage::Domain,std::allocator<ot::commissioner::persistent_storage::Domain>>>,std::function<bool(ot::commissioner::persistent_storage::Domain_const&)>>
            (&local_50,&local_70,
             (back_insert_iterator<std::vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>_>
              )aRet,&local_90);
  std::_Function_base::~_Function_base(&local_90.super__Function_base);
  return (ulong)((long)(aRet->
                       super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(aRet->
                      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                      )._M_impl.super__Vector_impl_data._M_start) <=
         (ulong)((long)pDVar2 - (long)pDVar1);
}

Assistant:

Status LookupPred(std::function<bool(V const &)> aPred, std::vector<V> &aRet, std::string aArrName)
    {
        size_t prevSize = aRet.size();
        std::copy_if(std::begin(mCache[aArrName]), std::end(mCache[aArrName]), std::back_inserter(aRet), aPred);

        if (aRet.size() > prevSize)
        {
            return Status::kSuccess;
        }

        return Status::kNotFound;
    }